

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O3

void sbs_ensure_room(sbs_t *sbs,uint32_t v)

{
  uint uVar1;
  uint64_t *puVar2;
  uint uVar3;
  
  if (sbs->size <= v >> 6) {
    uVar3 = (v >> 6) * 3 + 3 >> 1;
    puVar2 = (uint64_t *)realloc(sbs->words,(ulong)(uVar3 * 8));
    sbs->words = puVar2;
    uVar1 = sbs->size;
    if (uVar1 < uVar3) {
      memset(puVar2 + uVar1,0,(ulong)(~uVar1 + uVar3) * 8 + 8);
    }
    sbs->size = uVar3;
  }
  return;
}

Assistant:

void sbs_ensure_room(sbs_t *sbs, uint32_t v) {
    uint32_t i = v / 64;
    if (i >= sbs->size) {
        uint32_t new_size = (i + 1) * 3 / 2;
        sbs->words =
            (uint64_t *)realloc(sbs->words, new_size * sizeof(uint64_t));
        for (uint32_t j = sbs->size; j < new_size; j++) {
            sbs->words[j] = 0;
        }
        sbs->size = new_size;
    }
}